

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-01.cpp
# Opt level: O0

bool __thiscall
baryonyx::itm::
solver_inequalities_01coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>
::
compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
          (solver_inequalities_01coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>
           *this,bit_array *x,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> first,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> last,double kappa,
          double delta,double theta)

{
  int bkmin;
  row_iterator prVar1;
  int r_size_00;
  double x_00;
  bool bVar2;
  __tuple_element_t<0UL,_tuple<row_value_*,_row_value_*>_> *pprVar3;
  __tuple_element_t<1UL,_tuple<row_value_*,_row_value_*>_> *pprVar4;
  pointer begin;
  pointer prVar5;
  type pbVar6;
  type args;
  type prVar7;
  bool local_f1;
  undefined1 auStack_b8 [7];
  bool pi_change;
  string_view local_a8;
  int local_94;
  undefined1 auStack_90 [4];
  int i;
  int local_80;
  int local_7c;
  int selected;
  int r_size;
  tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*> it;
  int local_5c;
  undefined1 auStack_58 [4];
  int k;
  bool local_41;
  double dStack_40;
  bool at_least_one_pi_changed;
  double theta_local;
  double delta_local;
  double kappa_local;
  bit_array *x_local;
  solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
  *this_local;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> last_local;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> first_local;
  
  local_41 = false;
  dStack_40 = theta;
  theta_local = delta;
  delta_local = kappa;
  kappa_local = (double)x;
  x_local = (bit_array *)this;
  this_local = (solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                *)last._M_current;
  last_local = first;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_58,"update-row {} {} {}\n")
  ;
  debug_logger<true>::log<double,double,double>
            ((debug_logger<true> *)this,_auStack_58,&delta_local,&theta_local,
             &stack0xffffffffffffffc0);
  while( true ) {
    bVar2 = __gnu_cxx::operator==<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                      (&last_local,
                       (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       &this_local);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    it.
    super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
    .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl =
         (row_value *)last_local._M_current;
    local_5c = constraint<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                         (last_local);
    sparse_matrix<int>::row((sparse_matrix<int> *)&selected,(int)this + 0x10);
    pprVar3 = std::
              get<0ul,baryonyx::sparse_matrix<int>::row_value*,baryonyx::sparse_matrix<int>::row_value*>
                        ((tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                          *)&selected);
    prVar1 = *pprVar3;
    pprVar4 = std::
              get<1ul,baryonyx::sparse_matrix<int>::row_value*,baryonyx::sparse_matrix<int>::row_value*>
                        ((tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                          *)&selected);
    solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
    ::decrease_preference
              ((solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                *)this,prVar1,*pprVar4,dStack_40);
    pprVar3 = std::
              get<0ul,baryonyx::sparse_matrix<int>::row_value*,baryonyx::sparse_matrix<int>::row_value*>
                        ((tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                          *)&selected);
    prVar1 = *pprVar3;
    pprVar4 = std::
              get<1ul,baryonyx::sparse_matrix<int>::row_value*,baryonyx::sparse_matrix<int>::row_value*>
                        ((tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                          *)&selected);
    local_7c = solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
               ::compute_reduced_costs<baryonyx::bit_array>
                         ((solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                           *)this,prVar1,*pprVar4,(bit_array *)kappa_local);
    begin = std::
            unique_ptr<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
            ::get((unique_ptr<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
                   *)(this + 0x58));
    prVar5 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
             ::get((unique_ptr<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
                    *)(this + 0x58));
    calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_01coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>::rc_data*>
              (begin,prVar5 + local_7c,*(random_engine **)(this + 8));
    r_size_00 = local_7c;
    pbVar6 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[]>_>
             ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[]>_>
                           *)(this + 0x60),(long)local_5c);
    bkmin = pbVar6->min;
    pbVar6 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[]>_>
             ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[]>_>
                           *)(this + 0x60),(long)local_5c);
    local_80 = solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
               ::select_variables((solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                                   *)this,r_size_00,bkmin,pbVar6->max);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_90,
               "constraints {}: {} <= ");
    pbVar6 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[]>_>
             ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[]>_>
                           *)(this + 0x60),(long)local_5c);
    debug_logger<true>::log<int,int>((debug_logger<true> *)this,_auStack_90,&local_5c,&pbVar6->min);
    for (local_94 = 0; local_94 < local_7c; local_94 = local_94 + 1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a8,"({} {}) ")
      ;
      args = std::
             unique_ptr<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
             ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
                           *)(this + 0x58),(long)local_94);
      prVar7 = std::
               unique_ptr<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
               ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
                             *)(this + 0x58),(long)local_94);
      debug_logger<true>::log<double,int>
                ((debug_logger<true> *)this,local_a8,&args->value,&prVar7->id);
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_b8,
               "<= {} => Selected: {}\n");
    pbVar6 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[]>_>
             ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[]>_>
                           *)(this + 0x60),(long)local_5c);
    debug_logger<true>::log<int,int>((debug_logger<true> *)this,_auStack_b8,&pbVar6->max,&local_80);
    x_00 = kappa_local;
    pprVar3 = std::
              get<0ul,baryonyx::sparse_matrix<int>::row_value*,baryonyx::sparse_matrix<int>::row_value*>
                        ((tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                          *)&selected);
    bVar2 = affect<baryonyx::itm::solver_inequalities_01coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,double>
                      ((solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                        *)this,(bit_array *)x_00,*pprVar3,local_5c,local_80,local_7c,delta_local,
                       theta_local);
    local_f1 = true;
    if ((local_41 & 1U) == 0) {
      local_f1 = bVar2;
    }
    local_41 = local_f1;
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&last_local);
  }
  return (bool)(local_41 & 1);
}

Assistant:

bool compute_update_row(Xtype& x,
                            Iterator first,
                            Iterator last,
                            Float kappa,
                            Float delta,
                            Float theta)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto r_size =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
            int selected = select_variables(r_size, b[k].min, b[k].max);

            logger::log("constraints {}: {} <= ", k, b[k].min);

            for (int i = 0; i < r_size; ++i)
                logger::log("({} {}) ", R[i].value, R[i].id);

            logger::log("<= {} => Selected: {}\n", b[k].max, selected);

            auto pi_change = affect(
              *this, x, std::get<0>(it), k, selected, r_size, kappa, delta);

            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }